

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

Rule * __thiscall pegmatite::Rule::operator=(Rule *this,Rule *r)

{
  Rule *r_local;
  Rule *this_local;
  
  ExprPtr::operator=(&this->expr,&r->expr);
  return this;
}

Assistant:

Rule& Rule::operator=(Rule &&r)
{
	expr = std::move(r.expr);
	return *this;
}